

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

void relive::LogManager::setOutputFile(string *file)

{
  pointer pbVar1;
  LogManager *pLVar2;
  pointer pbVar3;
  runtime_error *this;
  LogManager *logManager;
  string *file_local;
  
  pLVar2 = instance(file);
  pbVar1 = (pointer)pLVar2->_os;
  pbVar3 = std::
           unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
           ::get(&pLVar2->_file);
  if (pbVar1 != pbVar3) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Filename cannot be set after first use of LogManager!");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void LogManager::setOutputFile(const std::string& file)
{
    LogManager* logManager = instance(file);
    if(logManager->_os != logManager->_file.get()) {
        throw std::runtime_error("Filename cannot be set after first use of LogManager!");
    }
}